

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O0

void __thiscall
avro::
NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
::printBasicInfo(NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                 *this,ostream *os)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Type TVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  undefined4 extraout_var_00;
  type pNVar7;
  ostream *in_RSI;
  Name *in_RDI;
  ostream *unaff_retaddr;
  size_t in_stack_00000008;
  SingleAttribute<avro::Name> *in_stack_00000010;
  int i;
  int count;
  undefined8 in_stack_ffffffffffffffb8;
  ostream *in_stack_ffffffffffffffc0;
  uint local_18;
  Name *n;
  
  TVar5 = (Type)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  n = in_RDI;
  Node::type((Node *)in_RDI);
  operator<<(in_stack_ffffffffffffffc0,TVar5);
  uVar2 = (*(*(_func_int ***)&in_RDI->ns_)[2])();
  if ((uVar2 & 1) != 0) {
    std::operator<<(in_RSI,' ');
    concepts::SingleAttribute<avro::Name>::get(in_stack_00000010,in_stack_00000008);
    operator<<(unaff_retaddr,n);
  }
  std::operator<<(in_RSI,'\n');
  iVar3 = (*(*(_func_int ***)&in_RDI->ns_)[4])();
  if (iVar3 == 0) {
    iVar3 = (*(*(_func_int ***)&in_RDI->ns_)[7])();
  }
  for (local_18 = 0; (int)local_18 < iVar3; local_18 = local_18 + 1) {
    in_stack_ffffffffffffffc0 = std::operator<<(in_RSI,"name ");
    iVar4 = (*(*(_func_int ***)&in_RDI->ns_)[8])(in_RDI,(ulong)local_18);
    poVar6 = std::operator<<(in_stack_ffffffffffffffc0,(string *)CONCAT44(extraout_var,iVar4));
    std::operator<<(poVar6,'\n');
    TVar5 = Node::type((Node *)in_RDI);
    if (TVar5 != AVRO_NUM_TYPES) {
      iVar4 = (*(*(_func_int ***)&in_RDI->ns_)[5])(in_RDI,(ulong)local_18);
      pNVar7 = boost::shared_ptr<avro::Node>::operator->
                         ((shared_ptr<avro::Node> *)CONCAT44(extraout_var_00,iVar4));
      (*pNVar7->_vptr_Node[0xe])(pNVar7,in_RSI);
    }
  }
  TVar5 = Node::type((Node *)in_RDI);
  bVar1 = isCompound(TVar5);
  if (bVar1) {
    poVar6 = std::operator<<(in_RSI,"end ");
    TVar5 = (Type)((ulong)poVar6 >> 0x20);
    Node::type((Node *)in_RDI);
    poVar6 = operator<<(in_stack_ffffffffffffffc0,TVar5);
    std::operator<<(poVar6,'\n');
  }
  return;
}

Assistant:

inline void 
NodeImpl<A,B,C,D>::printBasicInfo(std::ostream &os) const
{
    os << type();
    if(hasName()) {
        os << ' ' << nameAttribute_.get();
    }

    if(D::hasAttribute) {
        os << " " << sizeAttribute_.get();
    }
    os << '\n';
    int count = leaves();
    count = count ? count : names();
    for(int i= 0; i < count; ++i) {
        if( C::hasAttribute ) {
            os << "name " << nameAt(i) << '\n';
        }
        if( type() != AVRO_SYMBOLIC && leafAttributes_.hasAttribute) {
            leafAt(i)->printBasicInfo(os);
        }
    }
    if(isCompound(type())) {
        os << "end " << type() << '\n';
    }
}